

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:374:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:374:3)>
      *this)

{
  PromiseNode *pPVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  Disposer *pDVar5;
  RequestHook *pRVar6;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  PropagateException local_219;
  Own<kj::_::PromiseNode> local_218;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_200;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_1c8;
  Maybe<capnp::MessageSize> local_190;
  ExceptionOrValue local_178;
  char local_18;
  
  local_190.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_1c8,&((this->func).env)->membraned,&local_190);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&local_200,(int)&local_1c8,__buf,in_RCX,in_R8D);
  heap<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>,kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>>::ignoreResult()::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>>::ignoreResult()::_lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>&&)_1_,kj::_::PropagateException>
            ((Own<kj::_::PromiseNode> *)&local_178,(anon_class_1_0_00000001_for_func *)&local_200,
             &local_219);
  local_218.disposer =
       (Disposer *)CONCAT71(local_178.exception.ptr._1_7_,local_178.exception.ptr.isSet);
  local_218.ptr = (PromiseNode *)local_178.exception.ptr.field_1.value.ownFile.content.ptr;
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  waitImpl(&local_218,&local_178,(((this->func).env)->io).waitScope);
  if (local_18 == '\x01') {
    if (local_178.exception.ptr.isSet != false) {
      throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_178.exception.ptr.isSet == false) {
      unreachable();
    }
    throwRecoverableException(&local_178.exception.ptr.field_1.value,0);
  }
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  pPVar1 = local_218.ptr;
  if (local_218.ptr != (PromiseNode *)0x0) {
    local_218.ptr = (PromiseNode *)0x0;
    (**(local_218.disposer)->_vptr_Disposer)
              (local_218.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pDVar5 = local_200.hook.disposer;
  uVar4 = local_200.super_Builder._builder._32_8_;
  if (local_200.super_Builder._builder._32_8_ != 0) {
    local_200.super_Builder._builder.dataSize = 0;
    local_200.super_Builder._builder.pointerCount = 0;
    local_200.super_Builder._builder._38_2_ = 0;
    local_200.hook.disposer = (Disposer *)0x0;
    (**(local_200.hook.ptr)->_vptr_RequestHook)(local_200.hook.ptr,uVar4,8,pDVar5,pDVar5,0);
  }
  pWVar3 = local_200.super_Builder._builder.pointers;
  if (local_200.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_200.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_200.super_Builder._builder.data)
              (local_200.super_Builder._builder.data,
               (long)&(pWVar3->offsetAndKind).value + *(long *)((long)*pWVar3 + -0x10));
  }
  pCVar2 = local_200.super_Builder._builder.capTable;
  if (local_200.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_200.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_200.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_200.super_Builder._builder.segment,
      (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar6 = local_1c8.hook.ptr;
  if (local_1c8.hook.ptr != (RequestHook *)0x0) {
    local_1c8.hook.ptr = (RequestHook *)0x0;
    (**(local_1c8.hook.disposer)->_vptr_Disposer)
              (local_1c8.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  return;
}

Assistant:

void run() override {
    func();
  }